

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void clockOff(HighsMipAnalysis *analysis)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  if (analysis->analyse_mip_time == true) {
    bVar1 = HighsMipAnalysis::mipTimerRunning(analysis,0x23);
    bVar2 = HighsMipAnalysis::mipTimerRunning(analysis,0x24);
    bVar3 = HighsMipAnalysis::mipTimerRunning(analysis,0x25);
    if ((char)(bVar2 + bVar1) == '\0' && bVar3 == 0) {
      printf("HighsMipSolverData::clockOff Clocks running are (%d; %d; %d)\n",(ulong)bVar1,
             (ulong)bVar2,(ulong)(uint)bVar3);
    }
    if (bVar1) {
      HighsMipAnalysis::mipTimerStop(analysis,0x23);
    }
    if (bVar2) {
      HighsMipAnalysis::mipTimerStop(analysis,0x24);
    }
    if (bVar3) {
      HighsMipAnalysis::mipTimerStop(analysis,0x25);
      return;
    }
  }
  return;
}

Assistant:

void clockOff(HighsMipAnalysis& analysis) {
  if (!analysis.analyse_mip_time) return;
  // Make sure that exactly one of the following clocks is running
  const int clock0_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode0) ? 1 : 0;
  const int clock1_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode1) ? 1 : 0;
  const int clock2_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode2) ? 1 : 0;
  const bool one_running = clock0_running + clock1_running + clock2_running;
  if (!one_running)
    printf("HighsMipSolverData::clockOff Clocks running are (%d; %d; %d)\n",
           clock0_running, clock1_running, clock2_running);
  assert(one_running);
  if (clock0_running) analysis.mipTimerStop(kMipClockEvaluateRootNode0);
  if (clock1_running) analysis.mipTimerStop(kMipClockEvaluateRootNode1);
  if (clock2_running) analysis.mipTimerStop(kMipClockEvaluateRootNode2);
}